

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O0

void __thiscall Lodtalk::ClassBuilder::finish(ClassBuilder *this)

{
  VMContext *pVVar1;
  bool bVar2;
  size_type sVar3;
  Array *pointer;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  Class *pCVar5;
  reference native;
  void *pvVar6;
  SmallIntegerValue SVar7;
  Oop *array;
  Oop varNameSymbol;
  size_t i;
  ClassBuilder *this_local;
  
  pVVar1 = this->context;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->instanceVariableNames);
  pointer = Array::basicNativeNew(pVVar1,sVar3);
  aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(pointer);
  pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  (pCVar5->super_ClassDescription).instanceVariables.field_0 = aVar4;
  for (varNameSymbol.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)0x0;
      aVar4.uintValue =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&this->instanceVariableNames), (ulong)varNameSymbol.field_0 < aVar4.pointer;
      varNameSymbol.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)((long)varNameSymbol.field_0 + 1))
  {
    pVVar1 = this->context;
    native = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->instanceVariableNames,(size_type)varNameSymbol.field_0);
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)ByteSymbol::fromNative(pVVar1,native);
    pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    pvVar6 = Oop::getFirstFieldPointer(&(pCVar5->super_ClassDescription).instanceVariables);
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)pvVar6 + (long)varNameSymbol.field_0 * 8) = aVar4;
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->instanceVariableNames);
  if (!bVar2) {
    pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    SVar7 = Oop::decodeSmallInteger
                      (&(pCVar5->super_ClassDescription).super_Behavior.fixedVariableCount);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->instanceVariableNames);
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(SVar7 + sVar3);
    pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    (pCVar5->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 = aVar4;
    pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    SVar7 = Oop::decodeSmallInteger(&(pCVar5->super_ClassDescription).super_Behavior.format);
    if (SVar7 == 0) {
      aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(1);
      pCVar5 = Ref<Lodtalk::Class>::operator->(&this->clazz);
      (pCVar5->super_ClassDescription).super_Behavior.format.field_0 = aVar4;
    }
  }
  createClassMethodDict(this);
  createMetaclassMethodDict(this);
  return;
}

Assistant:

void ClassBuilder::finish()
{
    clazz->instanceVariables = Oop::fromPointer(Array::basicNativeNew(context, instanceVariableNames.size()));
    for(size_t i = 0; i < instanceVariableNames.size(); ++i)
    {
        auto varNameSymbol = ByteSymbol::fromNative(context, instanceVariableNames[i]);
        auto array = reinterpret_cast<Oop*> (clazz->instanceVariables.getFirstFieldPointer());
        array[i] = varNameSymbol;
    }

    // Set the fixed variable count.
    if(!instanceVariableNames.empty())
    {
        clazz->fixedVariableCount = Oop::encodeSmallInteger(clazz->fixedVariableCount.decodeSmallInteger() + instanceVariableNames.size());
        if(clazz->format.decodeSmallInteger() == OF_EMPTY)
            clazz->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
    }

    createClassMethodDict();
    createMetaclassMethodDict();
}